

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O0

char * __thiscall CommandOptions::szPictureRate(CommandOptions *this)

{
  CommandOptions *this_local;
  
  if (this->picture_rate == 0x10) {
    this_local = (CommandOptions *)anon_var_dwarf_8b99;
  }
  else if (this->picture_rate == 0x12) {
    this_local = (CommandOptions *)anon_var_dwarf_8ba6;
  }
  else if (this->picture_rate == 0x14) {
    this_local = (CommandOptions *)0x11eb1a;
  }
  else if (this->picture_rate == 0x16) {
    this_local = (CommandOptions *)anon_var_dwarf_8bc0;
  }
  else if (this->picture_rate == 0x17) {
    this_local = (CommandOptions *)anon_var_dwarf_8bcd;
  }
  else if (this->picture_rate == 0x18) {
    this_local = (CommandOptions *)anon_var_dwarf_8bda;
  }
  else if (this->picture_rate == 0x19) {
    this_local = (CommandOptions *)anon_var_dwarf_8be7;
  }
  else if (this->picture_rate == 0x1e) {
    this_local = (CommandOptions *)anon_var_dwarf_8bf4;
  }
  else if (this->picture_rate == 0x30) {
    this_local = (CommandOptions *)anon_var_dwarf_8c01;
  }
  else if (this->picture_rate == 0x32) {
    this_local = (CommandOptions *)anon_var_dwarf_8c0e;
  }
  else if (this->picture_rate == 0x3c) {
    this_local = (CommandOptions *)anon_var_dwarf_8c1b;
  }
  else if (this->picture_rate == 0x60) {
    this_local = (CommandOptions *)anon_var_dwarf_8c28;
  }
  else if (this->picture_rate == 100) {
    this_local = (CommandOptions *)anon_var_dwarf_8c35;
  }
  else if (this->picture_rate == 0x78) {
    this_local = (CommandOptions *)anon_var_dwarf_8c42;
  }
  else if (this->picture_rate == 0xc0) {
    this_local = (CommandOptions *)anon_var_dwarf_8c4f;
  }
  else if (this->picture_rate == 200) {
    this_local = (CommandOptions *)anon_var_dwarf_8c5c;
  }
  else if (this->picture_rate == 0xf0) {
    this_local = (CommandOptions *)anon_var_dwarf_8c69;
  }
  else {
    this_local = (CommandOptions *)anon_var_dwarf_8bda;
  }
  return &this_local->error_flag;
}

Assistant:

const char* szPictureRate()
  {
    if ( picture_rate == 16 ) return "16";
    if ( picture_rate == 18 ) return "18.182";
    if ( picture_rate == 20 ) return "20";
    if ( picture_rate == 22 ) return "21.818";
    if ( picture_rate == 23 ) return "23.976";
    if ( picture_rate == 24 ) return "24";
    if ( picture_rate == 25 ) return "25";
    if ( picture_rate == 30 ) return "30";
    if ( picture_rate == 48 ) return "48";
    if ( picture_rate == 50 ) return "50";
    if ( picture_rate == 60 ) return "60";
    if ( picture_rate == 96 ) return "96";
    if ( picture_rate == 100 ) return "100";
    if ( picture_rate == 120 ) return "120";
    if ( picture_rate == 192 ) return "192";
    if ( picture_rate == 200 ) return "200";
    if ( picture_rate == 240 ) return "240";
    return "24";
  }